

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::LayerNormalizationLayerParams::MergePartialFromCodedStream
          (LayerNormalizationLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  float *pfVar4;
  bool bVar5;
  int length;
  uint32 uVar6;
  int byte_limit;
  WeightParams *this_00;
  pair<int,_int> pVar7;
  char cVar8;
  ulong uVar9;
  float fVar10;
  float local_3c;
  RepeatedField<long> *local_38;
  
  local_38 = &this->normalizedshape_;
LAB_0024d3ca:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0024d3ed;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0024d3ed:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) goto switchD_0024d44a_default;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 == '\b') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (1,10,input,local_38);
      }
      else {
        if ((uVar6 & 0xff) != 10) break;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          (input,local_38);
      }
      goto LAB_0024d42e;
    case 2:
      if (cVar8 == '\x15') {
        pfVar4 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)&local_3c);
          fVar10 = local_3c;
          if (!bVar5) {
            return false;
          }
        }
        else {
          fVar10 = *pfVar4;
          input->buffer_ = (uint8 *)(pfVar4 + 1);
        }
        this->eps_ = fVar10;
        goto LAB_0024d3ca;
      }
      break;
    case 3:
      if (cVar8 != '\x1a') break;
      this_00 = this->gamma_;
      if (this_00 == (WeightParams *)0x0) {
        this_00 = (WeightParams *)operator_new(0x50);
        WeightParams::WeightParams(this_00);
        this->gamma_ = this_00;
      }
LAB_0024d4c4:
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (byte_limit < 0) {
          return false;
        }
      }
      pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,byte_limit);
      if ((long)pVar7 < 0) {
        return false;
      }
      bVar5 = WeightParams::MergePartialFromCodedStream(this_00,input);
      if (!bVar5) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar7.first);
      goto LAB_0024d42e;
    case 4:
      if (cVar8 == '\"') {
        this_00 = this->beta_;
        if (this_00 == (WeightParams *)0x0) {
          this_00 = (WeightParams *)operator_new(0x50);
          WeightParams::WeightParams(this_00);
          this->beta_ = this_00;
        }
        goto LAB_0024d4c4;
      }
    }
switchD_0024d44a_default:
    if (uVar6 == 0) {
      return true;
    }
    if ((uVar6 & 7) == 4) {
      return true;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_0024d42e:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool LayerNormalizationLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LayerNormalizationLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 normalizedShape = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_normalizedshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_normalizedshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float eps = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &eps_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams gamma = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gamma()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams beta = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LayerNormalizationLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LayerNormalizationLayerParams)
  return false;
#undef DO_
}